

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::NavUpdateCreateWrappingRequest(void)

{
  ImGuiNavLayer IVar1;
  float fVar2;
  ImGuiNavMoveFlags move_flags;
  ImGuiDir clip_dir;
  ImRect bb_rel;
  bool do_forward;
  ImGuiWindow *window;
  ImGuiContext *g;
  ImGuiScrollFlags in_stack_ffffffffffffffc8;
  ImGuiNavMoveFlags in_stack_ffffffffffffffcc;
  ImGuiDir in_stack_ffffffffffffffd0;
  uint move_dir;
  ImRect local_24;
  char local_11;
  ImGuiWindow *local_10;
  ImGuiContext *local_8;
  
  local_8 = GImGui;
  local_10 = GImGui->NavWindow;
  local_11 = '\0';
  local_24.Min = local_10->NavRectRel[GImGui->NavLayer].Min;
  local_24.Max = (&local_10->NavRectRel[GImGui->NavLayer].Min)[1];
  move_dir = GImGui->NavMoveFlags;
  if ((GImGui->NavMoveDir == 0) && ((move_dir & 5) != 0)) {
    fVar2 = (local_10->ContentSize).x + (local_10->WindowPadding).x;
    local_24.Max.x = fVar2;
    local_24.Min.x = fVar2;
    if ((move_dir & 4) != 0) {
      fVar2 = ImRect::GetHeight(&local_24);
      ImRect::TranslateY(&local_24,-fVar2);
    }
    local_11 = '\x01';
  }
  if ((local_8->NavMoveDir == 1) && ((move_dir & 5) != 0)) {
    fVar2 = (local_10->WindowPadding).x;
    local_24.Max = (ImVec2)(CONCAT44(local_24.Max.y,fVar2) ^ 0x80000000);
    local_24.Min = (ImVec2)(CONCAT44(local_24.Min.y,fVar2) ^ 0x80000000);
    if ((move_dir & 4) != 0) {
      fVar2 = ImRect::GetHeight(&local_24);
      ImRect::TranslateY(&local_24,fVar2);
    }
    local_11 = '\x01';
  }
  if ((local_8->NavMoveDir == 2) && ((move_dir & 10) != 0)) {
    fVar2 = (local_10->ContentSize).y + (local_10->WindowPadding).y;
    local_24.Max.y = fVar2;
    local_24.Min.y = fVar2;
    if ((move_dir & 8) != 0) {
      fVar2 = ImRect::GetWidth(&local_24);
      ImRect::TranslateX(&local_24,-fVar2);
    }
    local_11 = '\x01';
  }
  if ((local_8->NavMoveDir == 3) && ((move_dir & 10) != 0)) {
    fVar2 = (local_10->WindowPadding).y;
    local_24.Max = (ImVec2)(CONCAT44(fVar2,local_24.Max.x) ^ 0x8000000000000000);
    local_24.Min = (ImVec2)(CONCAT44(fVar2,local_24.Min.x) ^ 0x8000000000000000);
    if ((move_dir & 8) != 0) {
      fVar2 = ImRect::GetWidth(&local_24);
      ImRect::TranslateX(&local_24,fVar2);
    }
    local_11 = '\x01';
  }
  if (local_11 != '\0') {
    IVar1 = local_8->NavLayer;
    local_10->NavRectRel[IVar1].Min = local_24.Min;
    (&local_10->NavRectRel[IVar1].Min)[1] = local_24.Max;
    NavMoveRequestForward
              (move_dir,in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc,
               in_stack_ffffffffffffffc8);
  }
  return;
}

Assistant:

static void ImGui::NavUpdateCreateWrappingRequest()
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.NavWindow;

    bool do_forward = false;
    ImRect bb_rel = window->NavRectRel[g.NavLayer];
    ImGuiDir clip_dir = g.NavMoveDir;
    const ImGuiNavMoveFlags move_flags = g.NavMoveFlags;
    if (g.NavMoveDir == ImGuiDir_Left && (move_flags & (ImGuiNavMoveFlags_WrapX | ImGuiNavMoveFlags_LoopX)))
    {
        bb_rel.Min.x = bb_rel.Max.x = window->ContentSize.x + window->WindowPadding.x;
        if (move_flags & ImGuiNavMoveFlags_WrapX)
        {
            bb_rel.TranslateY(-bb_rel.GetHeight()); // Previous row
            clip_dir = ImGuiDir_Up;
        }
        do_forward = true;
    }
    if (g.NavMoveDir == ImGuiDir_Right && (move_flags & (ImGuiNavMoveFlags_WrapX | ImGuiNavMoveFlags_LoopX)))
    {
        bb_rel.Min.x = bb_rel.Max.x = -window->WindowPadding.x;
        if (move_flags & ImGuiNavMoveFlags_WrapX)
        {
            bb_rel.TranslateY(+bb_rel.GetHeight()); // Next row
            clip_dir = ImGuiDir_Down;
        }
        do_forward = true;
    }
    if (g.NavMoveDir == ImGuiDir_Up && (move_flags & (ImGuiNavMoveFlags_WrapY | ImGuiNavMoveFlags_LoopY)))
    {
        bb_rel.Min.y = bb_rel.Max.y = window->ContentSize.y + window->WindowPadding.y;
        if (move_flags & ImGuiNavMoveFlags_WrapY)
        {
            bb_rel.TranslateX(-bb_rel.GetWidth()); // Previous column
            clip_dir = ImGuiDir_Left;
        }
        do_forward = true;
    }
    if (g.NavMoveDir == ImGuiDir_Down && (move_flags & (ImGuiNavMoveFlags_WrapY | ImGuiNavMoveFlags_LoopY)))
    {
        bb_rel.Min.y = bb_rel.Max.y = -window->WindowPadding.y;
        if (move_flags & ImGuiNavMoveFlags_WrapY)
        {
            bb_rel.TranslateX(+bb_rel.GetWidth()); // Next column
            clip_dir = ImGuiDir_Right;
        }
        do_forward = true;
    }
    if (!do_forward)
        return;
    window->NavRectRel[g.NavLayer] = bb_rel;
    NavMoveRequestForward(g.NavMoveDir, clip_dir, move_flags, g.NavMoveScrollFlags);
}